

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::DistinctSizeTest::DistinctSizeTest
          (DistinctSizeTest *this,Context *group,char *name,char *desc)

{
  char *__s;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *desc_local;
  char *name_local;
  Context *group_local;
  DistinctSizeTest *this_local;
  
  local_28 = desc;
  desc_local = name;
  name_local = (char *)group;
  group_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
  TestBase::TestBase(&this->super_TestBase,group,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DistinctSizeTest_032d4f78;
  return;
}

Assistant:

DistinctSizeTest	(Context& group,
										 const char* name, const char* desc)
						: TestBase		(group, name, desc) {}